

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate.cc
# Opt level: O1

shared_ptr<const_bssl::ParsedCertificate> __thiscall
bssl::ParsedCertificate::Create
          (ParsedCertificate *this,UniquePtr<CRYPTO_BUFFER> *backing_data,
          ParseCertificateOptions *options,CertErrors *errors)

{
  pointer __p;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  bool bVar6;
  _Optional_payload_base<unsigned_char> _Var7;
  bssl *pbVar8;
  uchar *puVar9;
  _Optional_payload_base<bssl::SignatureAlgorithm> _Var10;
  const_iterator cVar11;
  ParsedCertificate *pPVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_05;
  size_t extraout_RDX_07;
  size_t extraout_RDX_08;
  size_t extraout_RDX_09;
  size_t extraout_RDX_10;
  size_t extraout_RDX_11;
  size_t extraout_RDX_12;
  size_t extraout_RDX_13;
  size_t extraout_RDX_14;
  size_t extraout_RDX_15;
  size_t extraout_RDX_17;
  size_t extraout_RDX_19;
  size_t sVar13;
  byte bVar14;
  ParsedCertificate *pPVar15;
  _Base_ptr p_Var16;
  shared_ptr<const_bssl::ParsedCertificate> sVar17;
  Input general_names_tlv;
  Input extension_value;
  Input extension_value_00;
  Input certificate_tlv;
  Input tbs_tlv;
  Input tlv;
  Input name_rdn_sequence;
  Input tlv_00;
  Input name_rdn_sequence_00;
  Input basic_constraints_tlv;
  Input key_usage_tlv;
  Input extension_value_01;
  Input authority_info_access_tlv;
  Input policy_constraints_tlv;
  Input policy_mappings_tlv;
  Input inhibit_any_policy_tlv;
  Input extension_value_02;
  Input extension_value_03;
  shared_ptr<bssl::ParsedCertificate> result;
  Input subject_value;
  Input issuer_value;
  CertErrors unused_errors;
  _Head_base<0UL,_crypto_buffer_st_*,_false> out_errors;
  ParsedCertificate *pPVar18;
  ParsedCertificate *pPVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  _Storage<bssl::ParsedAuthorityKeyIdentifier,_false> local_b8;
  char local_70;
  bssl *local_68;
  uchar *puStack_60;
  bssl *local_58;
  uchar *puStack_50;
  size_t extraout_RDX_04;
  size_t extraout_RDX_06;
  size_t extraout_RDX_16;
  size_t extraout_RDX_18;
  
  CertErrors::CertErrors((CertErrors *)&stack0xffffffffffffffb8);
  if (errors == (CertErrors *)0x0) {
    errors = (CertErrors *)&stack0xffffffffffffffb8;
  }
  out_errors._M_head_impl = (crypto_buffer_st *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bssl::ParsedCertificate,std::allocator<bssl::ParsedCertificate>,bssl::ParsedCertificate::PrivateConstructor>
            (&local_c0,(ParsedCertificate **)&stack0xffffffffffffff38,
             (allocator<bssl::ParsedCertificate> *)&local_b8,(PrivateConstructor *)&local_68);
  __p = (backing_data->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  (backing_data->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
  ::std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)out_errors._M_head_impl,
             __p);
  pbVar8 = (bssl *)CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                      (((optional<bssl::der::Input> *)
                                       &((ParsedCertificate *)out_errors._M_head_impl)->cert_data_)
                                      ->super__Optional_base<bssl::der::Input,_true,_true>).
                                      _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                      _M_payload._M_value.data_.data_);
  puVar9 = (uchar *)CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                      (((optional<bssl::der::Input> *)
                                       &((ParsedCertificate *)out_errors._M_head_impl)->cert_data_)
                                      ->super__Optional_base<bssl::der::Input,_true,_true>).
                                      _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                      _M_payload._M_value.data_.data_);
  (((ParsedCertificate *)out_errors._M_head_impl)->cert_).data_.data_ = (uchar *)pbVar8;
  (((ParsedCertificate *)out_errors._M_head_impl)->cert_).data_.size_ = (size_t)puVar9;
  certificate_tlv.data_.size_ =
       (size_t)&((ParsedCertificate *)out_errors._M_head_impl)->tbs_certificate_tlv_;
  certificate_tlv.data_.data_ = puVar9;
  pPVar12 = (ParsedCertificate *)errors;
  bVar6 = ParseCertificate(pbVar8,certificate_tlv,
                           &((ParsedCertificate *)out_errors._M_head_impl)->signature_algorithm_tlv_
                           ,&(((ParsedCertificate *)out_errors._M_head_impl)->signature_value_).
                             bytes_,(BitString *)errors,(CertErrors *)out_errors._M_head_impl);
  if (bVar6) {
    tbs_tlv.data_.size_ = (size_t)options;
    tbs_tlv.data_.data_ =
         (uchar *)(((optional<bssl::der::Input> *)
                   &((ParsedCertificate *)out_errors._M_head_impl)->tbs_certificate_tlv_)->
                  super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_;
    pPVar15 = (ParsedCertificate *)errors;
    bVar6 = ParseTbsCertificate((bssl *)(((optional<bssl::der::Input> *)
                                         &((ParsedCertificate *)out_errors._M_head_impl)->
                                          tbs_certificate_tlv_)->
                                        super__Optional_base<bssl::der::Input,_true,_true>).
                                        _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                        _M_payload._M_value.data_.data_,tbs_tlv,
                                (ParseCertificateOptions *)
                                &((ParsedCertificate *)out_errors._M_head_impl)->tbs_,
                                (ParsedTbsCertificate *)errors,(CertErrors *)pPVar12);
    if (bVar6) {
      _Var10 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
               ParseSignatureAlgorithm
                         ((Input)(((ParsedCertificate *)out_errors._M_head_impl)->
                                 signature_algorithm_tlv_).data_);
      (((ParsedCertificate *)out_errors._M_head_impl)->signature_algorithm_).
      super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm> = _Var10;
      local_68 = (bssl *)0x0;
      puStack_60 = (uchar *)0x0;
      tlv.data_.size_ = (size_t)&local_68;
      tlv.data_.data_ =
           (uchar *)(((ParsedCertificate *)out_errors._M_head_impl)->tbs_).subject_tlv.data_.size_;
      bVar6 = anon_unknown_0::GetSequenceValue
                        ((anon_unknown_0 *)
                         (((ParsedCertificate *)out_errors._M_head_impl)->tbs_).subject_tlv.data_.
                         data_,tlv,(Input *)out_errors._M_head_impl);
      if (bVar6) {
        name_rdn_sequence.data_.size_ =
             &((ParsedCertificate *)out_errors._M_head_impl)->normalized_subject_;
        name_rdn_sequence.data_.data_ = puStack_60;
        pPVar12 = (ParsedCertificate *)errors;
        bVar6 = NormalizeName(local_68,name_rdn_sequence,(string *)errors,(CertErrors *)pPVar15);
        if (bVar6) {
          local_58 = (bssl *)0x0;
          puStack_50 = (uchar *)0x0;
          tlv_00.data_.size_ = (size_t)&local_58;
          tlv_00.data_.data_ =
               (uchar *)(((ParsedCertificate *)out_errors._M_head_impl)->tbs_).issuer_tlv.data_.
                        size_;
          bVar6 = anon_unknown_0::GetSequenceValue
                            ((anon_unknown_0 *)
                             (((ParsedCertificate *)out_errors._M_head_impl)->tbs_).issuer_tlv.data_
                             .data_,tlv_00,(Input *)pPVar12);
          if (bVar6) {
            name_rdn_sequence_00.data_.size_ =
                 (size_t)&((ParsedCertificate *)out_errors._M_head_impl)->normalized_issuer_;
            name_rdn_sequence_00.data_.data_ = puStack_50;
            pPVar12 = (ParsedCertificate *)errors;
            bVar6 = NormalizeName(local_58,name_rdn_sequence_00,(string *)errors,
                                  (CertErrors *)pPVar15);
            if (bVar6) {
              if (*(char *)&((Input *)
                            ((long)&((ParsedCertificate *)out_errors._M_head_impl)->tbs_ + 0xb8))->
                            data_ == '\x01') {
                bVar6 = ParseExtensions((Input)*(Span<const_unsigned_char> *)
                                                ((long)&((ParsedCertificate *)
                                                        out_errors._M_head_impl)->tbs_ + 0xa8),
                                        &((ParsedCertificate *)out_errors._M_head_impl)->extensions_
                                       );
                if (!bVar6) {
                  CertErrors::AddError(errors,"Failed parsing extensions");
                  goto LAB_004b54f3;
                }
                local_b8._0_8_ = &kBasicConstraintsOid;
                local_b8._8_8_ = 3;
                sVar13 = extraout_RDX;
                pPVar18 = (ParsedCertificate *)out_errors._M_head_impl;
                if (*(bool *)((long)&(((ParsedCertificate *)out_errors._M_head_impl)->tbs_).
                                     extensions_tlv + 0x10) == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(((ParsedCertificate *)out_errors._M_head_impl)->extensions_).
                                   _M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_00;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      (_Rb_tree_header *)
                      ((long)&(((ParsedCertificate *)out_errors._M_head_impl)->extensions_)._M_t +
                      8U)) goto LAB_004b553b;
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar14 = *(byte *)&cVar11._M_node[2]._M_left;
                  bVar6 = true;
                }
                else {
LAB_004b553b:
                  bVar14 = 0;
                  p_Var16 = (_Base_ptr)0x0;
                  pbVar8 = (bssl *)0x0;
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar18->has_basic_constraints_ = true;
                  basic_constraints_tlv.data_.size_ = (size_t)&pPVar18->basic_constraints_;
                  basic_constraints_tlv.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParseBasicConstraints
                                    (pbVar8,basic_constraints_tlv,(ParsedBasicConstraints *)pPVar12)
                  ;
                  sVar13 = extraout_RDX_02;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing basic constraints");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kKeyUsageOid;
                local_b8._8_8_ = 3;
                pPVar19 = pPVar18;
                if (*(bool *)((long)&(pPVar18->tbs_).extensions_tlv.
                                     super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                     super__Optional_payload_base<bssl::der::Input> + 0x10) == true)
                {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar18->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_03;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar18->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    bVar14 = 0;
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b55d6;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar14 = *(byte *)&cVar11._M_node[2]._M_left;
                  bVar6 = true;
                }
                else {
LAB_004b55d6:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar19->has_key_usage_ = true;
                  key_usage_tlv.data_.size_ = &pPVar19->key_usage_;
                  key_usage_tlv.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParseKeyUsage(pbVar8,key_usage_tlv,(BitString *)pPVar12);
                  sVar13 = extraout_RDX_04;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing key usage");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kExtKeyUsageOid;
                local_b8._8_8_ = 3;
                pPVar18 = pPVar19;
                if ((pPVar19->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar19->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_05;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar19->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    bVar14 = 0;
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5669;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar14 = *(byte *)&cVar11._M_node[2]._M_left;
                  bVar6 = true;
                }
                else {
LAB_004b5669:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar18->has_extended_key_usage_ = true;
                  extension_value_01.data_.size_ = &pPVar18->extended_key_usage_;
                  extension_value_01.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParseEKUExtension(pbVar8,extension_value_01,
                                            (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                             *)pPVar12);
                  sVar13 = extraout_RDX_06;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing extended key usage");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kSubjectAltNameOid;
                local_b8._8_8_ = 3;
                pPVar19 = pPVar18;
                if ((pPVar18->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar18->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  pPVar12 = (ParsedCertificate *)&pPVar18->subject_alt_names_extension_;
                  if ((_Rb_tree_header *)cVar11._M_node !=
                      &(pPVar18->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    (pPVar18->subject_alt_names_extension_).critical =
                         *(bool *)&cVar11._M_node[2]._M_left;
                    p_Var1 = cVar11._M_node[1]._M_left;
                    p_Var2 = cVar11._M_node[1]._M_right;
                    p_Var3 = cVar11._M_node[2]._M_parent;
                    (pPVar18->subject_alt_names_extension_).value.data_.data_ =
                         *(uchar **)(cVar11._M_node + 2);
                    (pPVar18->subject_alt_names_extension_).value.data_.size_ = (size_t)p_Var3;
                    (((ParsedExtension *)pPVar12)->oid).data_.data_ = (uchar *)p_Var1;
                    (pPVar18->subject_alt_names_extension_).oid.data_.size_ = (size_t)p_Var2;
                    general_names_tlv.data_.size_ =
                         (size_t)(pPVar19->subject_alt_names_extension_).value.data_.data_;
                    general_names_tlv.data_.data_ = (uchar *)&local_b8;
                    pPVar12 = (ParsedCertificate *)errors;
                    GeneralNames::Create
                              (general_names_tlv,
                               (CertErrors *)
                               (pPVar19->subject_alt_names_extension_).value.data_.size_);
                    uVar5 = local_b8._0_8_;
                    local_b8._0_8_ = (undefined8 *)0x0;
                    ::std::
                    __uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
                    reset((__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                           *)&pPVar19->subject_alt_names_,(pointer)uVar5);
                    ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                    ::~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                                   *)&local_b8._M_value);
                    if ((pPVar19->subject_alt_names_)._M_t.
                        super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                        .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
                        (GeneralNames *)0x0) {
                      CertErrors::AddError(errors,"Failed parsing subjectAltName");
                    }
                    else {
                      sVar13 = extraout_RDX_08;
                      if ((puStack_60 != (uchar *)0x0) ||
                         ((pPVar19->subject_alt_names_extension_).critical != false))
                      goto LAB_004b5797;
                      CertErrors::AddError
                                (errors,"Empty subject and subjectAltName is not critical");
                    }
                    goto LAB_004b54f3;
                  }
                  (pPVar18->subject_alt_names_extension_).value.data_.data_ = (uchar *)0x0;
                  (pPVar18->subject_alt_names_extension_).value.data_.size_ = 0;
                  (((ParsedExtension *)pPVar12)->oid).data_.data_ = (uchar *)0x0;
                  (pPVar18->subject_alt_names_extension_).oid.data_.size_ = 0;
                  (pPVar18->subject_alt_names_extension_).critical = false;
                  sVar13 = extraout_RDX_07;
                }
LAB_004b5797:
                local_b8._0_8_ = &kNameConstraintsOid;
                local_b8._8_8_ = 3;
                pPVar18 = pPVar19;
                if ((pPVar19->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar19->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_09;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar19->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    bVar14 = 0;
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b57ef;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar14 = *(byte *)&cVar11._M_node[2]._M_left;
                  bVar6 = true;
                }
                else {
LAB_004b57ef:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar12 = (ParsedCertificate *)(ulong)(bVar14 & 1);
                  extension_value.data_.size_ = (size_t)pbVar8;
                  extension_value.data_.data_ = (uchar *)&local_b8;
                  pPVar15 = (ParsedCertificate *)errors;
                  NameConstraints::Create(extension_value,SUB81(p_Var16,0),(CertErrors *)pPVar12);
                  uVar5 = local_b8._0_8_;
                  local_b8._0_8_ = (undefined8 *)0x0;
                  ::std::
                  __uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                  ::reset((__uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                           *)&pPVar18->name_constraints_,(pointer)uVar5);
                  ::std::
                  unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>::
                  ~unique_ptr((unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                               *)&local_b8._M_value);
                  sVar13 = extraout_RDX_10;
                  if ((pPVar18->name_constraints_)._M_t.
                      super___uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bssl::NameConstraints_*,_std::default_delete<bssl::NameConstraints>_>
                      .super__Head_base<0UL,_bssl::NameConstraints_*,_false>._M_head_impl ==
                      (NameConstraints *)0x0) {
                    CertErrors::AddError(errors,"Failed parsing name constraints");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kAuthorityInfoAccessOid;
                local_b8._8_8_ = 8;
                pPVar19 = pPVar18;
                if ((pPVar18->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar18->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  pPVar12 = (ParsedCertificate *)&pPVar18->authority_info_access_extension_;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar18->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    (pPVar18->authority_info_access_extension_).value.data_.data_ = (uchar *)0x0;
                    (pPVar18->authority_info_access_extension_).value.data_.size_ = 0;
                    (((ParsedExtension *)pPVar12)->oid).data_.data_ = (uchar *)0x0;
                    (pPVar18->authority_info_access_extension_).oid.data_.size_ = 0;
                    (pPVar18->authority_info_access_extension_).critical = false;
                    sVar13 = extraout_RDX_11;
                  }
                  else {
                    (pPVar18->authority_info_access_extension_).critical =
                         *(bool *)&cVar11._M_node[2]._M_left;
                    p_Var1 = cVar11._M_node[1]._M_left;
                    p_Var2 = cVar11._M_node[1]._M_right;
                    p_Var3 = cVar11._M_node[2]._M_parent;
                    (pPVar18->authority_info_access_extension_).value.data_.data_ =
                         *(uchar **)(cVar11._M_node + 2);
                    (pPVar18->authority_info_access_extension_).value.data_.size_ = (size_t)p_Var3;
                    (((ParsedExtension *)pPVar12)->oid).data_.data_ = (uchar *)p_Var1;
                    (pPVar18->authority_info_access_extension_).oid.data_.size_ = (size_t)p_Var2;
                    pPVar19->has_authority_info_access_ = true;
                    pPVar12 = (ParsedCertificate *)&pPVar19->ocsp_uris_;
                    authority_info_access_tlv.data_.size_ = (size_t)&pPVar19->ca_issuers_uris_;
                    authority_info_access_tlv.data_.data_ =
                         (uchar *)(pPVar19->authority_info_access_extension_).value.data_.size_;
                    bVar6 = ParseAuthorityInfoAccessURIs
                                      ((bssl *)(pPVar19->authority_info_access_extension_).value.
                                               data_.data_,authority_info_access_tlv,
                                       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        *)pPVar12,
                                       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        *)pPVar15);
                    sVar13 = extraout_RDX_12;
                    if (!bVar6) {
                      CertErrors::AddError(errors,"Failed parsing authority info access");
                      goto LAB_004b54f3;
                    }
                  }
                }
                local_b8._0_8_ = &kCertificatePoliciesOid;
                local_b8._8_8_ = 3;
                pPVar15 = pPVar19;
                if ((pPVar19->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar19->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_13;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar19->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5974;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5974:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar15->has_policy_oids_ = true;
                  pPVar12 = (ParsedCertificate *)&pPVar15->policy_oids_;
                  extension_value_00.data_.size_ = (size_t)p_Var16;
                  extension_value_00.data_.data_ = (uchar *)pbVar8;
                  bVar6 = ParseCertificatePoliciesExtensionOids
                                    (extension_value_00,false,
                                     (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                                     pPVar12,errors);
                  sVar13 = extraout_RDX_14;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing certificate policies");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kPolicyConstraintsOid;
                local_b8._8_8_ = 3;
                pPVar18 = pPVar15;
                if ((pPVar15->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar15->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_15;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar15->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5a06;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5a06:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar18->has_policy_constraints_ = true;
                  policy_constraints_tlv.data_.size_ = &pPVar18->policy_constraints_;
                  policy_constraints_tlv.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParsePolicyConstraints
                                    (pbVar8,policy_constraints_tlv,
                                     (ParsedPolicyConstraints *)pPVar12);
                  sVar13 = extraout_RDX_16;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing policy constraints");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kPolicyMappingsOid;
                local_b8._8_8_ = 3;
                pPVar15 = pPVar18;
                if ((pPVar18->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar18->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_17;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar18->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5a93;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5a93:
                  bVar6 = false;
                }
                if (bVar6) {
                  pPVar15->has_policy_mappings_ = true;
                  policy_mappings_tlv.data_.size_ = &pPVar15->policy_mappings_;
                  policy_mappings_tlv.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParsePolicyMappings(pbVar8,policy_mappings_tlv,
                                              (vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                                               *)pPVar12);
                  sVar13 = extraout_RDX_18;
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing policy mappings");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kInhibitAnyPolicyOid;
                local_b8._8_8_ = 3;
                pPVar18 = pPVar15;
                if ((pPVar15->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar15->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  sVar13 = extraout_RDX_19;
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar15->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5b20;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5b20:
                  bVar6 = false;
                }
                if (bVar6) {
                  inhibit_any_policy_tlv.data_.size_ = sVar13;
                  inhibit_any_policy_tlv.data_.data_ = (uchar *)p_Var16;
                  pPVar12 = pPVar18;
                  _Var7 = (_Optional_payload_base<unsigned_char>)
                          ParseInhibitAnyPolicy(pbVar8,inhibit_any_policy_tlv);
                  (pPVar12->inhibit_any_policy_).super__Optional_base<unsigned_char,_true,_true>.
                  _M_payload.super__Optional_payload_base<unsigned_char> = _Var7;
                  pPVar18 = pPVar12;
                  if ((pPVar12->inhibit_any_policy_).super__Optional_base<unsigned_char,_true,_true>
                      ._M_payload.super__Optional_payload_base<unsigned_char>._M_engaged == false) {
                    CertErrors::AddError(errors,"Failed parsing inhibit any policy");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kSubjectKeyIdentifierOid;
                local_b8._8_8_ = 3;
                pPVar15 = pPVar18;
                if ((pPVar18->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar18->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar18->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5bab;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5bab:
                  bVar6 = false;
                }
                if (bVar6) {
                  (pPVar15->subject_key_identifier_).
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_ =
                       (uchar *)0x0;
                  (pPVar15->subject_key_identifier_).
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_ = 0
                  ;
                  (pPVar15->subject_key_identifier_).
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_engaged = true;
                  extension_value_02.data_.size_ = (size_t)&pPVar15->subject_key_identifier_;
                  extension_value_02.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParseSubjectKeyIdentifier(pbVar8,extension_value_02,(Input *)pPVar12);
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing subject key identifier");
                    goto LAB_004b54f3;
                  }
                }
                local_b8._0_8_ = &kAuthorityKeyIdentifierOid;
                local_b8._8_8_ = 3;
                out_errors._M_head_impl = (crypto_buffer_st *)pPVar15;
                if ((pPVar15->tbs_).extensions_tlv.
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
                  cVar11 = ::std::
                           _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           ::find(&(pPVar15->extensions_)._M_t,(key_type *)&local_b8._M_value);
                  if ((_Rb_tree_header *)cVar11._M_node ==
                      &(pPVar15->extensions_)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var16 = (_Base_ptr)0x0;
                    pbVar8 = (bssl *)0x0;
                    goto LAB_004b5c42;
                  }
                  pbVar8 = *(bssl **)(cVar11._M_node + 2);
                  p_Var16 = cVar11._M_node[2]._M_parent;
                  bVar6 = true;
                }
                else {
LAB_004b5c42:
                  bVar6 = false;
                }
                if (bVar6) {
                  ParsedAuthorityKeyIdentifier::ParsedAuthorityKeyIdentifier(&local_b8._M_value);
                  local_70 = '\x01';
                  ::std::_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>::_M_move_assign
                            ((_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                             &((ParsedCertificate *)out_errors._M_head_impl)->
                              authority_key_identifier_,
                             (_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                             &local_b8._M_value);
                  if (local_70 == '\x01') {
                    local_70 = '\0';
                    ParsedAuthorityKeyIdentifier::~ParsedAuthorityKeyIdentifier(&local_b8._M_value);
                  }
                  if (*(bool *)((long)&(((ParsedCertificate *)out_errors._M_head_impl)->
                                       authority_key_identifier_).
                                       super__Optional_base<bssl::ParsedAuthorityKeyIdentifier,_false,_false>
                                       ._M_payload + 0x48) == false) {
                    ::std::__throw_bad_optional_access();
                  }
                  extension_value_03.data_.size_ =
                       &((ParsedCertificate *)out_errors._M_head_impl)->authority_key_identifier_;
                  extension_value_03.data_.data_ = (uchar *)p_Var16;
                  bVar6 = ParseAuthorityKeyIdentifier
                                    (pbVar8,extension_value_03,
                                     (ParsedAuthorityKeyIdentifier *)pPVar12);
                  if (!bVar6) {
                    CertErrors::AddError(errors,"Failed parsing authority key identifier");
                    goto LAB_004b54f3;
                  }
                }
              }
              _Var4._M_pi = local_c0._M_pi;
              (this->cert_data_)._M_t.
              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                   out_errors._M_head_impl;
              (this->cert_).data_.data_ = (uchar *)0x0;
              local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (this->cert_).data_.data_ = (uchar *)_Var4._M_pi;
              goto LAB_004b54f9;
            }
            CertErrors::AddError(errors,"Failed normalizing issuer");
          }
          else {
            CertErrors::AddError(errors,"Failed reading issuer or subject");
          }
        }
        else {
          CertErrors::AddError(errors,"Failed normalizing subject");
        }
      }
      else {
        CertErrors::AddError(errors,"Failed reading issuer or subject");
      }
    }
    else {
      CertErrors::AddError(errors,"Failed parsing TBSCertificate");
    }
  }
  else {
    CertErrors::AddError(errors,"Failed parsing Certificate");
  }
LAB_004b54f3:
  (this->cert_data_)._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
  (this->cert_).data_.data_ = (uchar *)0x0;
LAB_004b54f9:
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
  CertErrors::~CertErrors((CertErrors *)&stack0xffffffffffffffb8);
  sVar17.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX_01._M_pi;
  sVar17.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<const_bssl::ParsedCertificate>)
         sVar17.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ParsedCertificate> ParsedCertificate::Create(
    bssl::UniquePtr<CRYPTO_BUFFER> backing_data,
    const ParseCertificateOptions &options, CertErrors *errors) {
  // |errors| is an optional parameter, but to keep the code simpler, use a
  // dummy object when one wasn't provided.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  auto result = std::make_shared<ParsedCertificate>(PrivateConstructor{});
  result->cert_data_ = std::move(backing_data);
  result->cert_ = der::Input(CRYPTO_BUFFER_data(result->cert_data_.get()),
                             CRYPTO_BUFFER_len(result->cert_data_.get()));

  if (!ParseCertificate(result->cert_, &result->tbs_certificate_tlv_,
                        &result->signature_algorithm_tlv_,
                        &result->signature_value_, errors)) {
    errors->AddError(kFailedParsingCertificate);
    return nullptr;
  }

  if (!ParseTbsCertificate(result->tbs_certificate_tlv_, options, &result->tbs_,
                           errors)) {
    errors->AddError(kFailedParsingTbsCertificate);
    return nullptr;
  }

  // Attempt to parse the signature algorithm contained in the Certificate.
  result->signature_algorithm_ =
      ParseSignatureAlgorithm(result->signature_algorithm_tlv_);

  der::Input subject_value;
  if (!GetSequenceValue(result->tbs_.subject_tlv, &subject_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(subject_value, &result->normalized_subject_, errors)) {
    errors->AddError(kFailedNormalizingSubject);
    return nullptr;
  }
  der::Input issuer_value;
  if (!GetSequenceValue(result->tbs_.issuer_tlv, &issuer_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(issuer_value, &result->normalized_issuer_, errors)) {
    errors->AddError(kFailedNormalizingIssuer);
    return nullptr;
  }

  // Parse the standard X.509 extensions.
  if (result->tbs_.extensions_tlv) {
    // ParseExtensions() ensures there are no duplicates, and maps the (unique)
    // OID to the extension value.
    if (!ParseExtensions(result->tbs_.extensions_tlv.value(),
                         &result->extensions_)) {
      errors->AddError(kFailedParsingExtensions);
      return nullptr;
    }

    ParsedExtension extension;

    // Basic constraints.
    if (result->GetExtension(der::Input(kBasicConstraintsOid), &extension)) {
      result->has_basic_constraints_ = true;
      if (!ParseBasicConstraints(extension.value,
                                 &result->basic_constraints_)) {
        errors->AddError(kFailedParsingBasicConstraints);
        return nullptr;
      }
    }

    // Key Usage.
    if (result->GetExtension(der::Input(kKeyUsageOid), &extension)) {
      result->has_key_usage_ = true;
      if (!ParseKeyUsage(extension.value, &result->key_usage_)) {
        errors->AddError(kFailedParsingKeyUsage);
        return nullptr;
      }
    }

    // Extended Key Usage.
    if (result->GetExtension(der::Input(kExtKeyUsageOid), &extension)) {
      result->has_extended_key_usage_ = true;
      if (!ParseEKUExtension(extension.value, &result->extended_key_usage_)) {
        errors->AddError(kFailedParsingEku);
        return nullptr;
      }
    }

    // Subject alternative name.
    if (result->GetExtension(der::Input(kSubjectAltNameOid),
                             &result->subject_alt_names_extension_)) {
      // RFC 5280 section 4.2.1.6:
      // SubjectAltName ::= GeneralNames
      result->subject_alt_names_ = GeneralNames::Create(
          result->subject_alt_names_extension_.value, errors);
      if (!result->subject_alt_names_) {
        errors->AddError(kFailedParsingSubjectAltName);
        return nullptr;
      }
      // RFC 5280 section 4.1.2.6:
      // If subject naming information is present only in the subjectAltName
      // extension (e.g., a key bound only to an email address or URI), then the
      // subject name MUST be an empty sequence and the subjectAltName extension
      // MUST be critical.
      if (subject_value.empty() &&
          !result->subject_alt_names_extension_.critical) {
        errors->AddError(kSubjectAltNameNotCritical);
        return nullptr;
      }
    }

    // Name constraints.
    if (result->GetExtension(der::Input(kNameConstraintsOid), &extension)) {
      result->name_constraints_ =
          NameConstraints::Create(extension.value, extension.critical, errors);
      if (!result->name_constraints_) {
        errors->AddError(kFailedParsingNameConstraints);
        return nullptr;
      }
    }

    // Authority information access.
    if (result->GetExtension(der::Input(kAuthorityInfoAccessOid),
                             &result->authority_info_access_extension_)) {
      result->has_authority_info_access_ = true;
      if (!ParseAuthorityInfoAccessURIs(
              result->authority_info_access_extension_.value,
              &result->ca_issuers_uris_, &result->ocsp_uris_)) {
        errors->AddError(kFailedParsingAia);
        return nullptr;
      }
    }

    // Policies.
    if (result->GetExtension(der::Input(kCertificatePoliciesOid), &extension)) {
      result->has_policy_oids_ = true;
      if (!ParseCertificatePoliciesExtensionOids(
              extension.value, false /*fail_parsing_unknown_qualifier_oids*/,
              &result->policy_oids_, errors)) {
        errors->AddError(kFailedParsingPolicies);
        return nullptr;
      }
    }

    // Policy constraints.
    if (result->GetExtension(der::Input(kPolicyConstraintsOid), &extension)) {
      result->has_policy_constraints_ = true;
      if (!ParsePolicyConstraints(extension.value,
                                  &result->policy_constraints_)) {
        errors->AddError(kFailedParsingPolicyConstraints);
        return nullptr;
      }
    }

    // Policy mappings.
    if (result->GetExtension(der::Input(kPolicyMappingsOid), &extension)) {
      result->has_policy_mappings_ = true;
      if (!ParsePolicyMappings(extension.value, &result->policy_mappings_)) {
        errors->AddError(kFailedParsingPolicyMappings);
        return nullptr;
      }
    }

    // Inhibit Any Policy.
    if (result->GetExtension(der::Input(kInhibitAnyPolicyOid), &extension)) {
      result->inhibit_any_policy_ = ParseInhibitAnyPolicy(extension.value);
      if (!result->inhibit_any_policy_) {
        errors->AddError(kFailedParsingInhibitAnyPolicy);
        return nullptr;
      }
    }

    // Subject Key Identifier.
    if (result->GetExtension(der::Input(kSubjectKeyIdentifierOid),
                             &extension)) {
      result->subject_key_identifier_ = std::make_optional<der::Input>();
      if (!ParseSubjectKeyIdentifier(
              extension.value, &result->subject_key_identifier_.value())) {
        errors->AddError(kFailedParsingSubjectKeyIdentifier);
        return nullptr;
      }
    }

    // Authority Key Identifier.
    if (result->GetExtension(der::Input(kAuthorityKeyIdentifierOid),
                             &extension)) {
      result->authority_key_identifier_ =
          std::make_optional<ParsedAuthorityKeyIdentifier>();
      if (!ParseAuthorityKeyIdentifier(
              extension.value, &result->authority_key_identifier_.value())) {
        errors->AddError(kFailedParsingAuthorityKeyIdentifier);
        return nullptr;
      }
    }
  }

  return result;
}